

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall mjs::interpreter::impl::put_value(impl *this,value *v,value *w)

{
  reference *p;
  long *plVar1;
  native_error_exception *this_00;
  wstring_view p_00;
  wstring local_1f8;
  wstring_view local_1d8;
  wchar_t *local_1c8;
  size_t local_1c0;
  wstring_view local_1a8;
  object_ptr b;
  
  if (v->type_ == reference) {
    p = value::reference_value(v);
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&b.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)p);
    if (this->strict_mode_ == true) {
      p_00 = string::view(&p->property_name_);
      check_strict_mode_put(this,&b,p_00);
    }
    if (b.super_gc_heap_ptr_untyped.heap_ == (gc_heap *)0x0) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&local_1f8,&(this->global_).super_gc_heap_ptr_untyped);
      gc_heap_ptr_untyped::operator=(&b.super_gc_heap_ptr_untyped,(gc_heap_ptr_untyped *)&local_1f8)
      ;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1f8);
    }
    plVar1 = (long *)gc_heap_ptr_untyped::get(&b.super_gc_heap_ptr_untyped);
    (**(code **)(*plVar1 + 8))(plVar1,&p->property_name_,w,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&b.super_gc_heap_ptr_untyped);
    return;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&b);
  debug_print((wostream *)&b,v,4,0x7fffffff,0);
  std::operator<<((wostream *)&b," is not a reference");
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1f8,this);
  local_1d8._M_len = local_1f8._M_string_length;
  local_1d8._M_str = local_1f8._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = local_1c0;
  local_1a8._M_str = local_1c8;
  native_error_exception::native_error_exception(this_00,reference,&local_1d8,&local_1a8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void put_value(const value& v, const value& w) const {
        if (v.type() != value_type::reference) {
            std::wostringstream woss;
            debug_print(woss, v, 4);
            woss << " is not a reference";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }
        auto& r = v.reference_value();
        auto b = r.base();
        if (strict_mode_) {
            check_strict_mode_put(b, r.property_name().view());
        }
        if (!b) {
            b = global_;
        }
        b->put(r.property_name(), w);
    }